

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::GridAxisIrregular::AddXiValue(GridAxisIrregular *this,KUINT16 Xi)

{
  iterator __position;
  KUINT16 local_a;
  
  __position._M_current =
       (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_a = Xi;
  if (__position._M_current ==
      (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_short,std::allocator<unsigned_short>>::
    _M_realloc_insert<unsigned_short_const&>
              ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->m_vXiValues,
               __position,&local_a);
  }
  else {
    *__position._M_current = Xi;
    (this->m_vXiValues).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  (this->super_GridAxisRegular).m_ui16NumPoints =
       (KUINT16)((uint)(*(int *)&(this->m_vXiValues).
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                       *(int *)&(this->m_vXiValues).
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 1);
  calculatePadding(this);
  return;
}

Assistant:

void GridAxisIrregular::AddXiValue( KUINT16 Xi )
{
    m_vXiValues.push_back( Xi );
    m_ui16NumPoints = m_vXiValues.size();
    calculatePadding();
}